

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void ra_append_move_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index)

{
  int iVar1;
  long lVar2;
  
  extend_array(ra,end_index - start_index);
  for (lVar2 = (long)start_index; lVar2 < end_index; lVar2 = lVar2 + 1) {
    iVar1 = ra->size;
    ra->keys[iVar1] = sa->keys[lVar2];
    ra->containers[iVar1] = sa->containers[lVar2];
    ra->typecodes[iVar1] = sa->typecodes[lVar2];
    ra->size = ra->size + 1;
  }
  return;
}

Assistant:

void ra_append_move_range(roaring_array_t *ra, roaring_array_t *sa,
                          int32_t start_index, int32_t end_index) {
    extend_array(ra, end_index - start_index);

    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;

        ra->keys[pos] = sa->keys[i];
        ra->containers[pos] = sa->containers[i];
        ra->typecodes[pos] = sa->typecodes[i];
        ra->size++;
    }
}